

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::IsStringOrMessage(FieldDescriptor *field)

{
  CppType CVar1;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  LogMessage *this;
  undefined8 in_stack_ffffffffffffff98;
  LogLevel level;
  undefined4 in_stack_ffffffffffffffa0;
  LogMessage local_48;
  bool local_1;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)0x435de3);
  if (CVar1 - CPPTYPE_INT32 < 8) {
    local_1 = false;
  }
  else if (CVar1 - CPPTYPE_STRING < 2) {
    local_1 = true;
  }
  else {
    this = &local_48;
    internal::LogMessage::LogMessage
              ((LogMessage *)CONCAT44(CVar1,in_stack_ffffffffffffffa0),level,(char *)this,
               in_stack_ffffffffffffff8c);
    internal::LogMessage::operator<<
              (this,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogFinisher::operator=
              ((LogFinisher *)this,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogMessage::~LogMessage((LogMessage *)0x435e63);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool IsStringOrMessage(const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_UINT64:
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_FLOAT:
    case FieldDescriptor::CPPTYPE_BOOL:
    case FieldDescriptor::CPPTYPE_ENUM:
      return false;
    case FieldDescriptor::CPPTYPE_STRING:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return true;
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return false;
}